

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void usage(string *binaryName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"MAP to JSON converter v0.0.1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)binaryName);
  poVar1 = std::operator<<(poVar1," <MAP filename>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void usage(std::string binaryName)
{
    std::cout << "MAP to JSON converter v0.0.1" << std::endl;
    std::cout << "Usage: " << binaryName << " <MAP filename>" << std::endl;
}